

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_cl_kernels.hpp
# Opt level: O0

void __thiscall OpenCLKernels::~OpenCLKernels(OpenCLKernels *this)

{
  OpenCLKernels *this_local;
  
  cv::ocl::Kernel::~Kernel(&this->kernel_calculate_accumulated_diff);
  cv::ocl::Kernel::~Kernel(&this->kernel_calculate_filtered_diff);
  cv::ocl::Kernel::~Kernel(&this->kernel_zero_flicker_counter);
  cv::ocl::Kernel::~Kernel(&this->kernel_update_masks);
  cv::ocl::Kernel::~Kernel(&this->kernel_update_flicker_counter);
  cv::ocl::Kernel::~Kernel(&this->kernel_update_similarity_levels);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~OpenCLKernels() = default;